

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

FillerParameter * __thiscall caffe::EmbedParameter::mutable_weight_filler(EmbedParameter *this)

{
  FillerParameter *this_00;
  EmbedParameter *this_local;
  
  set_has_weight_filler(this);
  if (this->weight_filler_ == (FillerParameter *)0x0) {
    this_00 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(this_00);
    this->weight_filler_ = this_00;
  }
  return this->weight_filler_;
}

Assistant:

inline ::caffe::FillerParameter* EmbedParameter::mutable_weight_filler() {
  set_has_weight_filler();
  if (weight_filler_ == NULL) {
    weight_filler_ = new ::caffe::FillerParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.EmbedParameter.weight_filler)
  return weight_filler_;
}